

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O2

void __thiscall
iDynTree::PrismaticJoint::computeChildAcc
          (PrismaticJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,LinkVelArray *linkVels,
          VectorDynSize *jntAcc,LinkAccArray *linkAccs,LinkIndex child,LinkIndex parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Twist *pTVar2;
  SpatialAcc *this_00;
  double dVar3;
  double dVar4;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Twist local_1e0 [48];
  Twist local_1b0 [48];
  SpatialMotionVector local_180;
  SpatialAcc local_150;
  Transform local_120 [48];
  SpatialAcc local_f0;
  SpatialAcc local_c0;
  SpatialMotionVector local_90;
  undefined1 local_60 [48];
  
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])();
  dVar3 = (double)iDynTree::VectorDynSize::operator()(jntVel,CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])(this);
  dVar4 = (double)iDynTree::VectorDynSize::operator()(jntAcc,CONCAT44(extraout_var_00,iVar1));
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[10])(this,jntPos,child,parent)
  ;
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[10])(this,jntPos,parent,child);
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0xc])
            (local_60,this,0,child,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_90,dVar3);
  LinkAccArray::operator()(linkAccs,parent);
  iDynTree::Transform::operator*(local_120,(SpatialAcc *)CONCAT44(extraout_var_01,iVar1));
  iDynTree::SpatialMotionVector::operator*(&local_180,dVar4);
  iDynTree::SpatialAcc::SpatialAcc(&local_150,&local_180);
  iDynTree::SpatialAcc::operator+(&local_f0,(SpatialAcc *)local_120);
  pTVar2 = LinkVelArray::operator()(linkVels,child);
  iDynTree::Twist::Twist(local_1e0,&local_90);
  iDynTree::Twist::operator*(local_1b0,pTVar2);
  iDynTree::SpatialAcc::operator+(&local_c0,&local_f0);
  this_00 = LinkAccArray::operator()(linkAccs,child);
  iDynTree::SpatialAcc::operator=(this_00,&local_c0);
  return;
}

Assistant:

void PrismaticJoint::computeChildAcc(const VectorDynSize &jntPos, const VectorDynSize &jntVel,
                                    const LinkVelArray &linkVels, const VectorDynSize &jntAcc,
                                    LinkAccArray &linkAccs, const LinkIndex child, const LinkIndex parent) const
{
    double ddist = jntVel(this->getDOFsOffset());
    double d2dist = jntAcc(this->getDOFsOffset());
    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);
    const Transform & parent_X_child = this->getTransform(jntPos,parent,child);
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);
    SpatialMotionVector vj = S*ddist;
    linkAccs(child) = child_X_parent*linkAccs(parent) + S*d2dist + linkVels(child)*vj;
}